

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_loadfile(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  TValue *pTVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  GCstr *filename;
  
  pTVar3 = L->base;
  pTVar5 = L->top;
  if ((pTVar3 < pTVar5) && ((pTVar3->field_2).it != 0xffffffff)) {
    pGVar2 = lj_lib_checkstr(L,1);
    pTVar3 = L->base;
    pTVar5 = L->top;
  }
  else {
    pGVar2 = (GCstr *)0x0;
  }
  if ((pTVar3 + 1 < pTVar5) && (*(int *)((long)pTVar3 + 0xc) != -1)) {
    pGVar4 = lj_lib_checkstr(L,2);
  }
  else {
    pGVar4 = (GCstr *)0x0;
  }
  lua_settop(L,3);
  filename = pGVar2 + 1;
  if (pGVar2 == (GCstr *)0x0) {
    filename = (GCstr *)0x0;
  }
  pGVar2 = pGVar4 + 1;
  if (pGVar4 == (GCstr *)0x0) {
    pGVar2 = (GCstr *)0x0;
  }
  iVar1 = luaL_loadfilex(L,(char *)filename,(char *)pGVar2);
  iVar1 = load_aux(L,iVar1,3);
  return iVar1;
}

Assistant:

LJLIB_CF(loadfile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  GCstr *mode = lj_lib_optstr(L, 2);
  int status;
  lua_settop(L, 3);  /* Ensure env arg exists. */
  status = luaL_loadfilex(L, fname ? strdata(fname) : NULL,
			  mode ? strdata(mode) : NULL);
  return load_aux(L, status, 3);
}